

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msg32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  undefined1 local_88 [4];
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  void *noncedata_local;
  secp256k1_nonce_function noncefp_local;
  uchar *seckey_local;
  uchar *msg32_local;
  secp256k1_ecdsa_signature *signature_local;
  secp256k1_context *ctx_local;
  
  iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)")
    ;
    ctx_local._4_4_ = 0;
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msg32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (signature == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"signature != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (seckey == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"seckey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ =
         secp256k1_ecdsa_sign_inner
                   (ctx,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_88,(int *)0x0,
                    (secp256k1_sha256 *)0x0,(secp256k1_ecdsa_s2c_opening *)0x0,(uchar *)0x0,msg32,
                    seckey,noncefp,noncedata);
    secp256k1_ecdsa_signature_save
              (signature,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_88);
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, NULL, NULL, NULL, msg32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}